

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O2

bool __thiscall AmsConnection::ReceiveNotification(AmsConnection *this,AoEHeader *header)

{
  RingBuffer *this_00;
  uint uVar1;
  uint8_t *buffer;
  element_type *peVar2;
  size_t sVar3;
  ostream *poVar4;
  bool bVar5;
  long lVar6;
  ulong bytesToRead;
  string sStack_1e8;
  SharedDispatcher dispatcher;
  stringstream stream;
  ostream local_1a8 [376];
  
  _stream = header->leTargetPort;
  DispatcherListGet((AmsConnection *)&dispatcher,(VirtualConnection *)this);
  peVar2 = dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    ReceiveJunk(this,(ulong)header->leLength);
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    std::operator<<(local_1a8,"No dispatcher found for notification");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&sStack_1e8);
  }
  else {
    this_00 = &(dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->ring;
    uVar1 = header->leLength;
    bytesToRead = (ulong)uVar1;
    sVar3 = RingBuffer::BytesFree(this_00);
    if (bytesToRead + 4 <= sVar3) {
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
        *(peVar2->ring).write = (uint8_t)(uVar1 >> ((byte)lVar6 & 0x1f));
        RingBuffer::Write(this_00,1);
      }
      while( true ) {
        sVar3 = RingBuffer::WriteChunk(this_00);
        buffer = (peVar2->ring).write;
        if (bytesToRead <= sVar3) break;
        Receive(this,buffer,sVar3,(timeval *)0x0);
        RingBuffer::Write(this_00,sVar3);
        bytesToRead = (ulong)(uint)((int)bytesToRead - (int)sVar3);
      }
      Receive(this,buffer,bytesToRead,(timeval *)0x0);
      RingBuffer::Write(this_00,bytesToRead);
      bVar5 = true;
      NotificationDispatcher::Notify
                (dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      goto LAB_00131396;
    }
    ReceiveJunk(this,bytesToRead);
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar4 = std::operator<<(local_1a8,"port ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,header->leTargetPort);
    std::operator<<(poVar4," receive buffer was full");
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&sStack_1e8);
  }
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  bVar5 = false;
LAB_00131396:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dispatcher.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar5;
}

Assistant:

bool AmsConnection::ReceiveNotification(const AoEHeader& header)
{
    const auto dispatcher = DispatcherListGet(VirtualConnection { header.targetPort(), header.sourceAms() });
    if (!dispatcher) {
        ReceiveJunk(header.length());
        LOG_WARN("No dispatcher found for notification");
        return false;
    }

    auto& ring = dispatcher->ring;
    auto bytesLeft = header.length();
    if (bytesLeft + sizeof(bytesLeft) > ring.BytesFree()) {
        ReceiveJunk(bytesLeft);
        LOG_WARN("port " << std::dec << header.targetPort() << " receive buffer was full");
        return false;
    }

    /** store AoEHeader.length() in ring buffer to support notification parsing */
    for (size_t i = 0; i < sizeof(bytesLeft); ++i) {
        *ring.write = (bytesLeft >> (8 * i)) & 0xFF;
        ring.Write(1);
    }

    auto chunk = ring.WriteChunk();
    while (bytesLeft > chunk) {
        Receive(ring.write, chunk);
        ring.Write(chunk);
        // We already checked bytesLeft > chunk, well it was not obvious enough for MSVC
        bytesLeft -= static_cast<decltype(bytesLeft)>(chunk);
        chunk = ring.WriteChunk();
    }
    Receive(ring.write, bytesLeft);
    ring.Write(bytesLeft);
    dispatcher->Notify();
    return true;
}